

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

Status __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolver::ParseTypeUrl
          (DescriptorPoolTypeResolver *this,string_view type_url,string *type_name)

{
  char *pcVar1;
  int iVar2;
  uintptr_t uVar3;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  Status SVar4;
  string *__n;
  void *in_R8;
  AlphaNum *in_R9;
  AlphaNum *d;
  size_type __rlen;
  string_view message;
  string local_110;
  long *local_f0;
  char *local_e8;
  long local_e0 [4];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  __n = (string *)type_url._M_str;
  d = in_R9;
  if ((((__n == (string *)0x0) ||
       ((__n <= type_name && (iVar2 = bcmp(in_R8,(char *)type_url._M_len,(size_t)__n), iVar2 == 0)))
       ) && (type_name != __n)) && (pcVar1 = (char *)((long)in_R8 + (long)__n), *pcVar1 == '/')) {
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,pcVar1 + 1,pcVar1 + ~(ulong)__n + 1 + (long)type_name);
    uVar3 = std::__cxx11::string::operator=((string *)in_R9,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,local_e0[0] + 1);
      uVar3 = extraout_RAX;
    }
    (this->super_TypeResolver)._vptr_TypeResolver = (_func_int **)0x1;
    return (Status)uVar3;
  }
  local_f0 = (long *)0x31;
  local_e8 = "Invalid type URL, type URLs must be of the form \'";
  local_90.piece_._M_len = 0x13;
  local_90.piece_._M_str = "/<typename>\', got: ";
  local_c0.piece_._M_len = (size_t)type_name;
  local_60.piece_._M_len = (size_t)__n;
  local_60.piece_._M_str = (char *)type_url._M_len;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_110,(lts_20250127 *)&local_f0,&local_60,&local_90,&local_c0,d);
  message._M_str = (char *)local_110._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::InvalidArgumentError(message);
  SVar4.rep_ = (uintptr_t)&local_110.field_2;
  if (local_110._M_dataplus._M_p != (pointer)SVar4.rep_) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    SVar4.rep_ = extraout_RAX_00;
  }
  return (Status)SVar4.rep_;
}

Assistant:

absl::Status ParseTypeUrl(absl::string_view type_url,
                            std::string* type_name) {
    absl::string_view stripped = type_url;
    if (!absl::ConsumePrefix(&stripped, url_prefix_) ||
        !absl::ConsumePrefix(&stripped, "/")) {
      return absl::InvalidArgumentError(
          absl::StrCat("Invalid type URL, type URLs must be of the form '",
                       url_prefix_, "/<typename>', got: ", type_url));
    }
    *type_name = std::string(stripped);
    return absl::Status();
  }